

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O3

FT_Error raccess_guess_apple_generic
                   (FT_Library library,FT_Stream stream,char *base_file_name,FT_Int32 magic,
                   FT_Long *result_offset)

{
  FT_Error *error_00;
  ulong uVar1;
  ulong uVar2;
  FT_UInt16 FVar3;
  FT_UInt32 FVar4;
  ulong in_RAX;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  FT_Error error;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  FVar4 = FT_Stream_ReadULong((FT_Stream)library,(FT_Error *)((long)&uStack_38 + 4));
  if (uStack_38._4_4_ != 0) {
    return uStack_38._4_4_;
  }
  if (FVar4 == (FT_UInt32)stream) {
    FT_Stream_ReadULong((FT_Stream)library,(FT_Error *)((long)&uStack_38 + 4));
    if (uStack_38._4_4_ != 0) {
      return uStack_38._4_4_;
    }
    uVar7 = *(long *)&library->version_patch + 0x10;
    if (library->modules[2] == (FT_Module)0x0) {
      uVar1._0_4_ = library->version_major;
      uVar1._4_4_ = library->version_minor;
      if (uVar1 < uVar7) {
        return 0x55;
      }
    }
    else {
      lVar5 = (*(code *)library->modules[2])(library,uVar7,0,0);
      if (lVar5 != 0) {
        return 0x55;
      }
    }
    *(ulong *)&library->version_patch = uVar7;
    uStack_38 = uStack_38 & 0xffffffff;
    FVar3 = FT_Stream_ReadUShort((FT_Stream)library,(FT_Error *)((long)&uStack_38 + 4));
    if (uStack_38._4_4_ != 0) {
      return uStack_38._4_4_;
    }
    if (FVar3 != 0) {
      uVar6 = (uint)FVar3;
      error_00 = (FT_Error *)((long)&uStack_38 + 4);
      do {
        FVar4 = FT_Stream_ReadULong((FT_Stream)library,error_00);
        if (uStack_38._4_4_ != 0) {
          return uStack_38._4_4_;
        }
        if (FVar4 == 2) {
          FVar4 = FT_Stream_ReadULong((FT_Stream)library,error_00);
          if (uStack_38._4_4_ == 0) {
            FT_Stream_ReadULong((FT_Stream)library,error_00);
            if (uStack_38._4_4_ == 0) {
              *(long *)base_file_name = (long)(int)FVar4;
              return 0;
            }
          }
        }
        else {
          uVar7 = *(long *)&library->version_patch + 8;
          if (library->modules[2] == (FT_Module)0x0) {
            uVar2._0_4_ = library->version_major;
            uVar2._4_4_ = library->version_minor;
            if (uVar2 < uVar7) {
              return 0x55;
            }
          }
          else {
            lVar5 = (*(code *)library->modules[2])(library,uVar7,0,0);
            if (lVar5 != 0) {
              return 0x55;
            }
          }
          *(ulong *)&library->version_patch = uVar7;
          uStack_38 = uStack_38 & 0xffffffff;
        }
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
  }
  return 2;
}

Assistant:

static FT_Error
  raccess_guess_apple_generic( FT_Library  library,
                               FT_Stream   stream,
                               char       *base_file_name,
                               FT_Int32    magic,
                               FT_Long    *result_offset )
  {
    FT_Int32   magic_from_stream;
    FT_Error   error;
    FT_Int32   version_number = 0;
    FT_UShort  n_of_entries;

    int        i;
    FT_Int32   entry_id, entry_offset, entry_length = 0;

    const FT_Int32  resource_fork_entry_id = 0x2;

    FT_UNUSED( library );
    FT_UNUSED( base_file_name );
    FT_UNUSED( version_number );
    FT_UNUSED( entry_length   );


    if ( FT_READ_LONG( magic_from_stream ) )
      return error;
    if ( magic_from_stream != magic )
      return FT_THROW( Unknown_File_Format );

    if ( FT_READ_LONG( version_number ) )
      return error;

    /* filler */
    error = FT_Stream_Skip( stream, 16 );
    if ( error )
      return error;

    if ( FT_READ_USHORT( n_of_entries ) )
      return error;
    if ( n_of_entries == 0 )
      return FT_THROW( Unknown_File_Format );

    for ( i = 0; i < n_of_entries; i++ )
    {
      if ( FT_READ_LONG( entry_id ) )
        return error;
      if ( entry_id == resource_fork_entry_id )
      {
        if ( FT_READ_LONG( entry_offset ) ||
             FT_READ_LONG( entry_length ) )
          continue;
        *result_offset = entry_offset;

        return FT_Err_Ok;
      }
      else
      {
        error = FT_Stream_Skip( stream, 4 + 4 );    /* offset + length */
        if ( error )
          return error;
      }
    }

    return FT_THROW( Unknown_File_Format );
  }